

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

void __thiscall QDockAreaLayoutInfo::add(QDockAreaLayoutInfo *this,QWidget *widget)

{
  QDockAreaLayoutInfo *this_00;
  long *plVar1;
  QDockWidget *dockWidget;
  QDockWidgetItem *this_01;
  QDockWidgetGroupWindow *pQVar2;
  undefined8 *puVar3;
  pointer pQVar4;
  QDockAreaLayoutItem *pQVar5;
  long lVar6;
  QLayoutItem *pQVar7;
  long in_FS_OFFSET;
  QDockAreaLayoutItem local_50;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  indexOf((QList<int> *)&local_50,this,widget);
  lVar6 = CONCAT44(local_50.placeHolderItem._4_4_,local_50.placeHolderItem._0_4_);
  QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&local_50);
  if (lVar6 == 0) {
    dockWidget = QtPrivate::qobject_cast_helper<QDockWidget*,QObject>(&widget->super_QObject);
    if (dockWidget == (QDockWidget *)0x0) {
      pQVar2 = QtPrivate::qobject_cast_helper<QDockWidgetGroupWindow*,QObject>
                         (&widget->super_QObject);
      if (pQVar2 == (QDockWidgetGroupWindow *)0x0) {
        pQVar5 = &local_50;
        local_50.widgetItem._0_4_ = 2;
        local_50.placeHolderItem._4_4_ = 0;
        local_50.widgetItem._4_4_ = 0;
        local_50.subinfo._0_4_ = 0;
        local_50.subinfo._4_4_ = 0;
        local_50.placeHolderItem._0_4_ = 0;
        local_50.pos = 0x5e5d56;
        local_50.size = 0;
        QMessageLogger::fatal
                  ((char *)pQVar5,
                   "Coding error. Add supports only QDockWidget and QDockWidgetGroupWindow");
        lVar6 = 0;
        for (pQVar7 = (QLayoutItem *)0x0; pQVar7 < pQVar5[2].widgetItem;
            pQVar7 = (QLayoutItem *)((long)&pQVar7->_vptr_QLayoutItem + 1)) {
          pQVar4 = QList<QDockAreaLayoutItem>::data((QList<QDockAreaLayoutItem> *)&pQVar5[1].pos);
          this_00 = *(QDockAreaLayoutInfo **)((long)&pQVar4->subinfo + lVar6);
          if (this_00 == (QDockAreaLayoutInfo *)0x0) {
            plVar1 = *(long **)((long)&pQVar4->widgetItem + lVar6);
            if (plVar1 != (long *)0x0) {
              (**(code **)(*plVar1 + 8))();
            }
            *(undefined8 *)((long)&pQVar4->widgetItem + lVar6) = 0;
          }
          else {
            deleteAllLayoutItems(this_00);
          }
          lVar6 = lVar6 + 0x28;
        }
        return;
      }
      puVar3 = (undefined8 *)operator_new(0x18);
      *(undefined4 *)(puVar3 + 1) = 0;
      puVar3[2] = pQVar2;
      *puVar3 = &PTR__QWidgetItem_007cbf10;
      local_50.widgetItem._0_4_ = SUB84(puVar3,0);
      local_50.widgetItem._4_4_ = (undefined4)((ulong)puVar3 >> 0x20);
      local_50.pos = 0;
      local_50.subinfo._0_4_ = 0;
      local_50.subinfo._4_4_ = 0;
      local_50.placeHolderItem._0_4_ = 0;
      local_50.placeHolderItem._4_4_ = 0;
      local_50.size = -1;
      local_50.flags = 0;
      QList<QDockAreaLayoutItem>::emplaceBack<QDockAreaLayoutItem>(&this->item_list,&local_50);
    }
    else {
      this_01 = (QDockWidgetItem *)operator_new(0x18);
      QDockWidgetItem::QDockWidgetItem(this_01,dockWidget);
      local_50.widgetItem._0_4_ = SUB84(this_01,0);
      local_50.widgetItem._4_4_ = (undefined4)((ulong)this_01 >> 0x20);
      local_50.pos = 0;
      local_50.subinfo._0_4_ = 0;
      local_50.subinfo._4_4_ = 0;
      local_50.placeHolderItem._0_4_ = 0;
      local_50.placeHolderItem._4_4_ = 0;
      local_50.size = -1;
      local_50.flags = 0;
      QList<QDockAreaLayoutItem>::emplaceBack<QDockAreaLayoutItem>(&this->item_list,&local_50);
    }
    QDockAreaLayoutItem::~QDockAreaLayoutItem(&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDockAreaLayoutInfo::add(QWidget *widget)
{
    // Do not add twice
    if (!indexOf(widget).isEmpty())
        return;

    if (auto *dockWidget = qobject_cast<QDockWidget *>(widget)) {
        item_list.append(QDockAreaLayoutItem(new QDockWidgetItem(dockWidget)));
        return;
    }

    if (auto *groupWindow = qobject_cast<QDockWidgetGroupWindow *>(widget)) {
        item_list.append(QDockAreaLayoutItem(new QDockWidgetGroupWindowItem(groupWindow)));
        return;
    }

    qFatal("Coding error. Add supports only QDockWidget and QDockWidgetGroupWindow");
}